

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::LoadExternalFile
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,string *err,string *warn,
               string *filename,string *basedir,bool required,size_t reqBytes,bool checkSize,
               FsCallbacks *fs)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  ulong uVar1;
  ostream *poVar2;
  void *this_00;
  string *local_3d0;
  string local_3b0 [32];
  stringstream local_390 [8];
  stringstream ss;
  ostream local_380 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  size_type local_1c8;
  size_t sz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_139;
  undefined1 local_138 [7];
  bool fileRead;
  string fileReadErr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string filepath;
  value_type local_90;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string *failMsgOut;
  bool checkSize_local;
  bool required_local;
  string *basedir_local;
  string *filename_local;
  string *warn_local;
  string *err_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  if ((((fs == (FsCallbacks *)0x0) || (fs->FileExists == (FileExistsFunction)0x0)) ||
      (fs->ExpandFilePath == (ExpandFilePathFunction)0x0)) ||
     (fs->ReadWholeFile == (ReadWholeFileFunction)0x0)) {
    if (err != (string *)0x0) {
      std::__cxx11::string::operator+=((string *)err,"FS callback[s] not set\n");
    }
    out_local._7_1_ = false;
  }
  else {
    local_3d0 = warn;
    if (required) {
      local_3d0 = err;
    }
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_3d0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(out);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60,basedir);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_90,".",(allocator *)(filepath.field_2._M_local_buf + 0xf));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)(filepath.field_2._M_local_buf + 0xf));
    FindFile((string *)local_b8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,filename,fs);
    uVar1 = std::__cxx11::string::empty();
    if (((uVar1 & 1) == 0) && (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
      this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&fileReadErr.field_2 + 8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this);
      std::__cxx11::string::string((string *)local_138);
      local_139 = (*fs->ReadWholeFile)(this,(string *)local_138,(string *)local_b8,fs->user_data);
      if ((bool)local_139) {
        local_1c8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               ((long)&fileReadErr.field_2 + 8));
        if (local_1c8 == 0) {
          if (paths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            std::operator+(&local_208,"File is empty : ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8);
            std::operator+(&local_1e8,&local_208,"\n");
            std::__cxx11::string::operator+=
                      ((string *)
                       paths.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_208);
          }
          out_local._7_1_ = false;
        }
        else if (checkSize) {
          if (reqBytes == local_1c8) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
                      (out,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           ((long)&fileReadErr.field_2 + 8));
            out_local._7_1_ = true;
          }
          else {
            std::__cxx11::stringstream::stringstream(local_390);
            poVar2 = std::operator<<(local_380,"File size mismatch : ");
            poVar2 = std::operator<<(poVar2,(string *)local_b8);
            poVar2 = std::operator<<(poVar2,", requestedBytes ");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,reqBytes);
            poVar2 = std::operator<<(poVar2,", but got ");
            this_00 = (void *)std::ostream::operator<<(poVar2,local_1c8);
            std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
            if (paths.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              std::__cxx11::stringstream::str();
              std::__cxx11::string::operator+=
                        ((string *)
                         paths.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,local_3b0);
              std::__cxx11::string::~string(local_3b0);
            }
            out_local._7_1_ = false;
            std::__cxx11::stringstream::~stringstream(local_390);
          }
        }
        else {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
                    (out,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)&fileReadErr.field_2 + 8));
          out_local._7_1_ = true;
        }
      }
      else {
        if (paths.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sz,
                         "File read error : ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          std::operator+(&local_1a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sz,
                         " : ");
          std::operator+(&local_180,&local_1a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138);
          std::operator+(&local_160,&local_180,"\n");
          std::__cxx11::string::operator+=
                    ((string *)
                     paths.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_160);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&sz);
        }
        out_local._7_1_ = false;
      }
      std::__cxx11::string::~string((string *)local_138);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&fileReadErr.field_2 + 8));
    }
    else {
      if (paths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        std::operator+(&local_f8,"File not found : ",filename);
        std::operator+(&local_d8,&local_f8,"\n");
        std::__cxx11::string::operator+=
                  ((string *)
                   paths.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
      }
      out_local._7_1_ = false;
    }
    std::__cxx11::string::~string((string *)local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
  }
  return out_local._7_1_;
}

Assistant:

static bool LoadExternalFile(std::vector<unsigned char> *out, std::string *err,
                             std::string *warn, const std::string &filename,
                             const std::string &basedir, bool required,
                             size_t reqBytes, bool checkSize, FsCallbacks *fs) {
  if (fs == nullptr || fs->FileExists == nullptr ||
      fs->ExpandFilePath == nullptr || fs->ReadWholeFile == nullptr) {
    // This is a developer error, assert() ?
    if (err) {
      (*err) += "FS callback[s] not set\n";
    }
    return false;
  }

  std::string *failMsgOut = required ? err : warn;

  out->clear();

  std::vector<std::string> paths;
  paths.push_back(basedir);
  paths.push_back(".");

  std::string filepath = FindFile(paths, filename, fs);
  if (filepath.empty() || filename.empty()) {
    if (failMsgOut) {
      (*failMsgOut) += "File not found : " + filename + "\n";
    }
    return false;
  }

  std::vector<unsigned char> buf;
  std::string fileReadErr;
  bool fileRead =
      fs->ReadWholeFile(&buf, &fileReadErr, filepath, fs->user_data);
  if (!fileRead) {
    if (failMsgOut) {
      (*failMsgOut) +=
          "File read error : " + filepath + " : " + fileReadErr + "\n";
    }
    return false;
  }

  size_t sz = buf.size();
  if (sz == 0) {
    if (failMsgOut) {
      (*failMsgOut) += "File is empty : " + filepath + "\n";
    }
    return false;
  }

  if (checkSize) {
    if (reqBytes == sz) {
      out->swap(buf);
      return true;
    } else {
      std::stringstream ss;
      ss << "File size mismatch : " << filepath << ", requestedBytes "
         << reqBytes << ", but got " << sz << std::endl;
      if (failMsgOut) {
        (*failMsgOut) += ss.str();
      }
      return false;
    }
  }

  out->swap(buf);
  return true;
}